

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeInternalForces
          (ChElementHexaANCF_3813 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_8,_3> *d0;
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer psVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  element_type *peVar18;
  undefined1 auVar19 [32];
  bool bVar20;
  Scalar *pSVar21;
  Scalar *pSVar22;
  Scalar *pSVar23;
  Scalar *pSVar24;
  Scalar *pSVar25;
  Scalar *pSVar26;
  Scalar *pSVar27;
  int j;
  long lVar28;
  int i;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  RealScalar RVar35;
  double detJ0C;
  double E;
  double v;
  ChVectorN<double,_9> alpha_eas;
  ChVectorN<double,_9> HE;
  ChVectorN<double,_9> renewed_alpha_eas;
  ChVectorN<double,_9> ResidHE;
  ChVectorN<double,_24> Finternal;
  ChMatrixNM<double,_8,_3> d;
  ChVectorN<double,_9> previous_alpha;
  ChMatrixNM<double,_6,_6> T0;
  ChMatrixNM<double,_9,_9> KALPHA;
  ChVectorN<double,_81> KALPHAvec;
  ChMatrixNM<double,_9,_9> KALPHA1;
  ChVectorN<double,_9> DAMMY_vec;
  ChVectorN<double,_216> GDEPSPvec;
  ChMatrixNM<double,_9,_24> GDEPSP;
  Brick_ForceAnalytical myformula;
  ChVectorN<double,_576> JACvec;
  ChMatrixNM<double,_24,_24> KTE;
  ChVectorN<double,_906> TempIntegratedResult;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>
  local_8cd0;
  ChVectorDynamic<> *local_8cc0;
  double local_8cb8;
  double local_8cb0;
  double local_8ca8;
  Matrix<double,_9,_1,_0,_9,_1> local_8ca0;
  Matrix<double,_9,_1,_0,_9,_1> local_8c58;
  Matrix<double,_9,_1,_0,_9,_1> local_8c10;
  undefined1 local_8bc8 [72];
  Matrix<double,_24,_1,_0,_24,_1> local_8b80;
  undefined1 local_8ac0 [64];
  undefined1 local_8a80 [64];
  undefined1 local_8a40 [64];
  Matrix<double,_9,_1,_0,_9,_1> local_89c8;
  ChMatrixNM<double,_6,_6> local_8980;
  Matrix<double,_9,_9,_1,_9,_9> local_8858;
  Matrix<double,_81,_1,_0,_81,_1> local_85d0;
  Matrix<double,_9,_9,_1,_9,_9> local_8348;
  VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1> local_80c0 [19];
  Matrix<double,_216,_1,_0,_216,_1> local_7c80;
  Matrix<double,_9,_24,_1,_9,_24> local_75c0;
  Brick_ForceAnalytical local_6f00;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>,_Eigen::Matrix<double,_9,_24,_1,_9,_24>,_0>
  local_4100 [192];
  Matrix<double,_24,_24,_1,_24,_24> local_2f00;
  DenseBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_> local_1cd0 [7328];
  
  psVar11 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar12 = (psVar11->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  peVar13 = psVar11[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar14 = psVar11[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar15 = psVar11[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar16 = psVar11[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)&peVar12->field_0x30;
  auVar31 = vbroadcastsd_avx512f(auVar4);
  auVar19 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((long)&peVar14->super_ChNodeFEAbase + 0x20)
                                 ),0xd0);
  peVar17 = psVar11[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar31 = vpermi2pd_avx512f(_DAT_00ecf000,
                              ZEXT2464(CONCAT816(auVar31._16_8_,
                                                 *(undefined1 (*) [16])
                                                  ((long)&peVar12->super_ChNodeFEAbase + 0x20))),
                              ZEXT1664(*(undefined1 (*) [16])
                                        ((long)&peVar13->super_ChNodeFEAbase + 0x20)));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)&peVar13->field_0x30;
  auVar32 = vbroadcastsd_avx512f(auVar5);
  auVar33._0_40_ = auVar31._0_40_;
  auVar33._40_8_ = auVar32._40_8_;
  auVar33._48_8_ = auVar31._48_8_;
  auVar33._56_8_ = auVar31._56_8_;
  local_8ac0 = vinsertf32x4_avx512f
                         (auVar33,*(undefined1 (*) [16])((long)&peVar15->super_ChNodeFEAbase + 0x10)
                          ,3);
  auVar19 = vblendpd_avx(auVar19,ZEXT832(*(ulong *)&peVar15->field_0x30),1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)&peVar14->field_0x30;
  auVar31 = vbroadcastsd_avx512f(auVar6);
  peVar12 = psVar11[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar13 = psVar11[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar31 = vinsertf32x4_avx512f
                      (ZEXT3264(CONCAT824(auVar31._24_8_,auVar19._0_24_)),
                       *(undefined1 (*) [16])((long)&peVar16->super_ChNodeFEAbase + 0x10),2);
  auVar32 = vinsertf32x4_avx512f
                      (ZEXT1664(*(undefined1 (*) [16])&peVar17->field_0x28),
                       *(undefined1 (*) [16])((long)&peVar12->super_ChNodeFEAbase + 0x10),1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)&peVar16->field_0x30;
  auVar33 = vbroadcastsd_avx512f(auVar7);
  local_8a80._48_8_ = auVar33._48_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)&peVar12->field_0x30;
  auVar33 = vbroadcastsd_avx512f(auVar8);
  auVar34._0_32_ = auVar32._0_32_;
  auVar34._32_8_ = auVar33._32_8_;
  auVar34._40_8_ = auVar32._40_8_;
  auVar34._48_8_ = auVar32._48_8_;
  auVar34._56_8_ = auVar32._56_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)((long)&peVar17->super_ChNodeFEAbase + 0x20);
  auVar32 = vbroadcastsd_avx512f(auVar9);
  local_8a80._0_48_ = auVar31._0_48_;
  local_8a80._56_8_ = auVar32._56_8_;
  auVar31 = vpermi2pd_avx512f(_DAT_00ecf040,auVar34,
                              ZEXT1664(*(undefined1 (*) [16])
                                        ((long)&peVar13->super_ChNodeFEAbase + 0x20)));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)&peVar13->field_0x30;
  auVar32 = vbroadcastsd_avx512f(auVar10);
  local_8a40._56_8_ = auVar32._56_8_;
  local_8a40._0_56_ = auVar31._0_56_;
  peVar18 = (this->m_Material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8ca8 = peVar18->v;
  local_8cb0 = peVar18->E;
  local_8cc0 = Fi;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fi);
  Eigen::internal::call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Matrix<double,9,1,0,9,1>>
            (&local_89c8,&this->m_stock_alpha_EAS);
  Eigen::internal::call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Matrix<double,9,1,0,9,1>>
            (&local_8ca0,&local_89c8);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)local_8bc8);
  d0 = &this->m_d0;
  bVar20 = true;
  while (bVar20) {
    local_6f00.element = (ChElementHexaANCF_3813 *)local_8bc8;
    local_6f00.super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>._vptr_ChIntegrable3D
         = (_func_int **)&local_8ca0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,1,0,9,1>const,Eigen::Matrix<double,9,1,0,9,1>const>>
              (&local_8ca0,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>
                *)&local_6f00);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Matrix<double,9,1,0,9,1>>
              (&local_8c10,&local_8ca0);
    Eigen::DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)&local_8b80);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)&local_8c58);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_> *)&local_75c0);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8858);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_8980);
    local_8cb8 = 0.0;
    T0DetJElementCenterForEAS(this,d0,&local_8980,&local_8cb8);
    if (this->m_isMooney == false) {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_6f00,(ChMatrixNM<double,_8,_3> *)local_8ac0,d0,this,&local_8980,&local_8cb8,
                 &local_8ca0,&local_8cb0,&local_8ca8);
    }
    else {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_6f00,(ChMatrixNM<double,_8,_3> *)local_8ac0,d0,this,&local_8980,&local_8cb8,
                 &local_8ca0);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>::setZero(local_1cd0);
    ChQuadrature::Integrate3D<Eigen::Matrix<double,906,1,0,906,1>>
              ((Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,
               &local_6f00.super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>,-1.0,1.0,
               -1.0,1.0,-1.0,1.0,2);
    Eigen::VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,_-1>::VectorBlock
              (local_80c0,(Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,0,0x18);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Block<Eigen::Matrix<double,906,1,0,906,1>,_1,1,false>>
              (&local_8b80,
               &local_80c0[0].super_Block<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1,_1,_false>);
    Eigen::VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,_-1>::VectorBlock
              (local_80c0,(Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,0x18,9);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Block<Eigen::Matrix<double,906,1,0,906,1>,_1,1,false>>
              (&local_8c58,
               &local_80c0[0].super_Block<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1,_1,_false>);
    Eigen::VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,_-1>::VectorBlock
              (local_80c0,(Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,0x21,0xd8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,216,1,0,216,1>,Eigen::Block<Eigen::Matrix<double,906,1,0,906,1>,_1,1,false>>
              (&local_7c80,
               &local_80c0[0].super_Block<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1,_1,_false>);
    Eigen::VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,_-1>::VectorBlock
              (local_80c0,(Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,0xf9,0x51);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,81,1,0,81,1>,Eigen::Block<Eigen::Matrix<double,906,1,0,906,1>,_1,1,false>>
              (&local_85d0,
               &local_80c0[0].super_Block<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1,_1,_false>);
    Eigen::VectorBlock<Eigen::Matrix<double,_906,_1,_0,_906,_1>,_-1>::VectorBlock
              (local_80c0,(Matrix<double,_906,_1,_0,_906,_1> *)local_1cd0,0x14a,0x240);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,576,1,0,576,1>,Eigen::Block<Eigen::Matrix<double,906,1,0,906,1>,_1,1,false>>
              ((Matrix<double,_576,_1,_0,_576,_1> *)local_4100,
               &local_80c0[0].super_Block<Eigen::Matrix<double,_906,_1,_0,_906,_1>,__1,_1,_false>);
    lVar30 = 0;
    for (lVar29 = 0; lVar29 != 9; lVar29 = lVar29 + 1) {
      for (lVar28 = 0; lVar28 != 0x18; lVar28 = lVar28 + 1) {
        pSVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_216,_1,_0,_216,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_216,_1,_0,_216,_1>,_1> *)
                             &local_7c80,lVar30 + lVar28);
        SVar1 = *pSVar21;
        pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)
                             &local_75c0,lVar29,lVar28);
        *pSVar22 = SVar1;
      }
      lVar30 = lVar30 + 0x18;
    }
    lVar30 = 0;
    for (lVar29 = 0; lVar29 != 9; lVar29 = lVar29 + 1) {
      for (lVar28 = 0; lVar28 != 9; lVar28 = lVar28 + 1) {
        pSVar23 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_1> *)
                             &local_85d0,lVar30 + lVar28);
        SVar2 = *pSVar23;
        pSVar24 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1> *)&local_8858
                             ,lVar29,lVar28);
        *pSVar24 = SVar2;
      }
      lVar30 = lVar30 + 9;
    }
    lVar30 = 0;
    for (lVar29 = 0; lVar29 != 0x18; lVar29 = lVar29 + 1) {
      for (lVar28 = 0; lVar28 != 0x18; lVar28 = lVar28 + 1) {
        pSVar25 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_1> *)
                             local_4100,lVar30 + lVar28);
        SVar3 = *pSVar25;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)
                             &local_2f00,lVar29,lVar28);
        *pSVar26 = SVar3;
      }
      lVar30 = lVar30 + 0x18;
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,9,1,9,9>,Eigen::Matrix<double,9,9,1,9,9>>
              (&local_8348,&local_8858);
    if (this->m_flag_HE == NUMERICAL) break;
    RVar35 = Eigen::MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)&local_8c58);
    bVar20 = false;
    if (1e-05 <= RVar35) {
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
      ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)local_80c0,
                 (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8348);
      local_8cd0 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>>::
                   solve<Eigen::Matrix<double,9,1,0,9,1>>
                             ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>>
                               *)local_80c0,
                              (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)&local_8c58);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>,Eigen::Matrix<double,9,1,0,9,1>>>
                ((Matrix<double,_9,_1,_0,_9,_1> *)local_8bc8,&local_8cd0);
      bVar20 = true;
    }
  }
  local_6f00.super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>._vptr_ChIntegrable3D =
       (_func_int **)&local_8b80;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,24,1,0,24,1>const>>
            (local_8cc0,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
              *)&local_6f00);
  if (this->m_flag_HE == ANALYTICAL) {
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[0] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[1] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[2] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[3] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[4] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[5] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[6] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[7] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7];
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[8] =
         local_8c10.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8];
    for (lVar29 = 0; lVar29 != 9; lVar29 = lVar29 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)local_80c0);
      pSVar27 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)local_80c0,
                           lVar29);
      *pSVar27 = 1.0;
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
      ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)local_4100,
                 (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8858);
      local_8cd0 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>>::
                   solve<Eigen::Matrix<double,9,1,0,9,1>>
                             ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>>
                               *)local_4100,
                              (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)local_80c0);
      Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_9,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_9,_1,_false> *)&local_85d0,
                 (Matrix<double,_9,_9,_1,_9,_9> *)&local_7c80,lVar29);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,9,1,false>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>,Eigen::Matrix<double,9,1,0,9,1>>>
                ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_9,_1,_false> *)&local_85d0,&local_8cd0
                );
    }
    local_4100[0].m_lhs.m_lhs.m_matrix = &local_75c0;
    local_4100[0].m_lhs.m_rhs = (RhsNested)&local_7c80;
    local_4100[0].m_rhs = local_4100[0].m_lhs.m_lhs.m_matrix;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,0>>
              ((Matrix<double,_24,_24,_1,_24,_24> *)&local_6f00,local_4100);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Matrix<double,24,24,1,24,24>>
              (&this->m_stock_KTE,&local_2f00);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Matrix<double,24,24,1,24,24>>
              (&this->m_stock_jac_EAS,(Matrix<double,_24,_24,_1,_24,_24> *)&local_6f00);
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    int ie = GetElemNum();

    ChVector<> pA = m_nodes[0]->GetPos();
    ChVector<> pB = m_nodes[1]->GetPos();
    ChVector<> pC = m_nodes[2]->GetPos();
    ChVector<> pD = m_nodes[3]->GetPos();
    ChVector<> pE = m_nodes[4]->GetPos();
    ChVector<> pF = m_nodes[5]->GetPos();
    ChVector<> pG = m_nodes[6]->GetPos();
    ChVector<> pH = m_nodes[7]->GetPos();

    ChMatrixNM<double, 8, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = pB.x();
    d(1, 1) = pB.y();
    d(1, 2) = pB.z();
    d(2, 0) = pC.x();
    d(2, 1) = pC.y();
    d(2, 2) = pC.z();
    d(3, 0) = pD.x();
    d(3, 1) = pD.y();
    d(3, 2) = pD.z();
    d(4, 0) = pE.x();
    d(4, 1) = pE.y();
    d(4, 2) = pE.z();
    d(5, 0) = pF.x();
    d(5, 1) = pF.y();
    d(5, 2) = pF.z();
    d(6, 0) = pG.x();
    d(6, 1) = pG.y();
    d(6, 2) = pG.z();
    d(7, 0) = pH.x();
    d(7, 1) = pH.y();
    d(7, 2) = pH.z();

    double v = m_Material->Get_v();
    double E = m_Material->Get_E();

    Fi.setZero();

    /// If numerical differentiation is used, only the internal force and EAS stiffness
    /// will be calculated. If the numerical differentiation is not used, the jacobian
    /// will also be calculated.
    bool use_numerical_differentiation = false;

    /// Internal force and EAS parameters are calculated for numerical differentiation.
    if (use_numerical_differentiation) {
        //////////////////////////////////////////////////////////////////////////////////////////////////////////
        ChVectorN<double, 330> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;

        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        /// Begin EAS loop
        while (fail == 1) {
            /// Update alpha EAS
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();
            HE.setZero();
            GDEPSP.setZero();
            KALPHA.setZero();

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);
            //== F_internal ==//
            // Choose constructors depending on m_isMooney
            Brick_ForceNumerical myformula =
                !m_isMooney ? Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 330>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            ///===============================================================//
            ///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            ///===TempIntegratedResult(24:32,1) -> HE(9x1)   brick   =========//
            ///===TempIntegratedResult(33:248,1) -> GDEPSP(9x24)     =========//
            ///===TempIntegratedResult(249:329,1) -> KALPHA(9x9)     =========//
            ///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            GDEPSP = Eigen::Map<ChMatrixNM<double, 9, 24>>(GDEPSPvec.data(), 9, 24);
            KALPHA = Eigen::Map<ChMatrixNM<double, 9, 9>>(KALPHAvec.data(), 9, 9);
            KALPHA1 = KALPHA;

            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();

            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
            if (m_flag_HE == ANALYTICAL && count > 2) {
                GetLog() << ie << "  count " << count << "  NormHE " << norm_HE << "\n";
            }
        }
        Fi = -Finternal;
        //== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        //== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    } else {
        ////////////////////////////////////////////////////////////////////////////////////////////////////////////

        ChVectorN<double, 906> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;
        // Enhanced Assumed Strain (EAS)
        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        // Loop to obtain convergence in EAS internal parameters alpha
        // This loops call ChQuadrature::Integrate3D on MyAnalyticalForce,
        // which calculates the Jacobian at every iteration of each time step
        int iteralpha = 0;  //  Counts number of iterations
        while (fail == 1) {
            iteralpha++;
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();  // Internal force vector
            HE.setZero();         // Internal force vector from EAS
            GDEPSP.setZero();     // Jacobian of EAS forces w.r.t. coordinates
            KALPHA.setZero();     // Jacobian of EAS forces w.r.t. EAS internal parameters

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);

            //== F_internal ==//
            Brick_ForceAnalytical myformula =
                !m_isMooney ? Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 906>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            //	///===============================================================//
            //	///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            //	///===TempIntegratedResult(24:28,1) -> HE(5x1)           =========//
            //	///===TempIntegratedResult(29:148,1) -> GDEPSP(5x24)     =========//
            //	///===TempIntegratedResult(149:173,1) -> KALPHA(5x5)     =========//
            //	///===TempIntegratedResult(174:749,1) -> Stiffness Matrix(24x24) =//
            //	///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            ChVectorN<double, 576> JACvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            JACvec = TempIntegratedResult.segment(330, 576);
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 24; j++) {
                    GDEPSP(i, j) = GDEPSPvec(i * 24 + j);
                }
            }
            // GDEPSP = GDEPSPvec;
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 9; j++) {
                    KALPHA(i, j) = KALPHAvec(i * 9 + j);
                }
            }
            // KALPHA = KALPHAvec;
            for (int i = 0; i < 24; i++) {
                for (int j = 0; j < 24; j++) {
                    KTE(i, j) = JACvec(i * 24 + j);
                }
            }
            // KTE = JACvec;

            // Calculation of the element Jacobian for implicit integrator
            // KTE and stock_jac_EAS_elem.
            KALPHA1 = KALPHA;
            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();
            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
        }  // end of while
        Fi = -Finternal;
        ////== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        ////== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_KTE = KTE;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    }  // end of else for numerical or analytical
}